

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

ConstSchema __thiscall capnp::Schema::asConst(Schema *this)

{
  bool bVar1;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  Schema *this_local;
  
  getProto((Reader *)&f,this);
  bVar1 = capnp::schema::Node::Reader::isConst((Reader *)&f);
  if (bVar1) {
    ConstSchema::ConstSchema((ConstSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_90,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],capnp::Text::Reader>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x125,FAILED,"getProto().isConst()",
               "\"Tried to use non-constant schema as a constant.\", getProto().getDisplayName()",
               (char (*) [48])"Tried to use non-constant schema as a constant.",(Reader *)&local_60)
    ;
    ConstSchema::ConstSchema((ConstSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return (ConstSchema)(Schema)this_local;
}

Assistant:

ConstSchema Schema::asConst() const {
  KJ_REQUIRE(getProto().isConst(), "Tried to use non-constant schema as a constant.",
             getProto().getDisplayName()) {
    return ConstSchema();
  }
  return ConstSchema(*this);
}